

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gest_trainer.cpp
# Opt level: O0

void __thiscall Am_Gesture_Trainer_Data::~Am_Gesture_Trainer_Data(Am_Gesture_Trainer_Data *this)

{
  Gesture_Class *pGVar1;
  Gesture_Class *next;
  Gesture_Class *c;
  Am_Gesture_Trainer_Data *this_local;
  
  (this->super_Am_Wrapper).super_Am_Registered_Type._vptr_Am_Registered_Type =
       (_func_int **)&PTR_ID_00410290;
  pGVar1 = this->head;
  while (next = pGVar1, next != (Gesture_Class *)0x0) {
    pGVar1 = next->next;
    if (next != (Gesture_Class *)0x0) {
      Gesture_Class::~Gesture_Class(next);
      operator_delete(next);
    }
  }
  this->tail = (Gesture_Class *)0x0;
  this->head = (Gesture_Class *)0x0;
  Am_Gesture_Classifier::~Am_Gesture_Classifier(&this->cached_classifier);
  Am_Wrapper::~Am_Wrapper(&this->super_Am_Wrapper);
  return;
}

Assistant:

Am_Gesture_Trainer_Data::~Am_Gesture_Trainer_Data()
{
  Gesture_Class *c, *next;

  for (c = head; c != nullptr; c = next) {
    next = c->next;
    delete c;
  }
  head = tail = nullptr;
}